

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t *rawSeqStore,size_t nbBytes)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (int)nbBytes + (int)rawSeqStore->posInSequence;
  do {
    if (uVar2 == 0) {
LAB_01f8d792:
      rawSeqStore->posInSequence = 0;
      return;
    }
    uVar1 = rawSeqStore->pos;
    if (rawSeqStore->size <= uVar1) {
LAB_01f8d78d:
      if (uVar1 != rawSeqStore->size) {
        return;
      }
      goto LAB_01f8d792;
    }
    uVar3 = rawSeqStore->seq[uVar1].matchLength + rawSeqStore->seq[uVar1].litLength;
    if (uVar2 < uVar3) {
      rawSeqStore->posInSequence = (ulong)uVar2;
      goto LAB_01f8d78d;
    }
    rawSeqStore->pos = uVar1 + 1;
    uVar2 = uVar2 - uVar3;
  } while( true );
}

Assistant:

static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}